

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

FileSystem * __thiscall efsw::FileSystem::precomposeFileName(FileSystem *this,string *name)

{
  string *name_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  return this;
}

Assistant:

std::string FileSystem::precomposeFileName( const std::string& name ) {
#if EFSW_OS == EFSW_OS_MACOSX
	CFStringRef cfStringRef =
		CFStringCreateWithCString( kCFAllocatorDefault, name.c_str(), kCFStringEncodingUTF8 );
	CFMutableStringRef cfMutable = CFStringCreateMutableCopy( NULL, 0, cfStringRef );

	CFStringNormalize( cfMutable, kCFStringNormalizationFormC );

	const char* c_str = CFStringGetCStringPtr( cfMutable, kCFStringEncodingUTF8 );
	if ( c_str != NULL ) {
		std::string result( c_str );
		CFRelease( cfStringRef );
		CFRelease( cfMutable );
		return result;
	}
	CFIndex length = CFStringGetLength( cfMutable );
	CFIndex maxSize = CFStringGetMaximumSizeForEncoding( length, kCFStringEncodingUTF8 );
	if ( maxSize == kCFNotFound ) {
		CFRelease( cfStringRef );
		CFRelease( cfMutable );
		return std::string();
	}

	std::string result( maxSize + 1, '\0' );
	if ( CFStringGetCString( cfMutable, &result[0], result.size(), kCFStringEncodingUTF8 ) ) {
		result.resize( std::strlen( result.c_str() ) );
		CFRelease( cfStringRef );
		CFRelease( cfMutable );
	} else {
		result.clear();
	}
	return result;
#else
	return name;
#endif
}